

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

uint32_t crc32(uint32_t seed,uchar *buf,size_t len)

{
  ulong uVar1;
  size_t sVar2;
  uchar *p;
  uint32_t crc;
  
  uVar1 = (ulong)seed;
  if (len != 0) {
    sVar2 = 0;
    do {
      seed = (uint)(uVar1 >> 8) ^ crc_32_tab[(byte)(buf[sVar2] ^ (byte)uVar1)];
      uVar1 = (ulong)seed;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  return seed;
}

Assistant:

uint32_t crc32(uint32_t seed, const unsigned char *buf, size_t len)
{
    uint32_t crc = seed;
    const unsigned char *p = buf;

    while (len) {
        crc = crc_32_tab[(crc ^ *p++) & 0xff] ^ (crc >> 8);
        len--;
    }

    return crc;
}